

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshNormals(CXMeshFileLoader *this,SXMesh *mesh)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pSVar5;
  pointer puVar6;
  pointer pSVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  bool bVar10;
  u32 uVar11;
  u32 uVar12;
  uint uVar13;
  u32 uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  array<irr::core::vector3d<float>_> normals;
  array<unsigned_int> polygonfaces;
  array<unsigned_int> normalIndices;
  string<char> local_c8;
  string<char> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined1 local_70;
  ulong local_60;
  string<char> local_58;
  
  bVar9 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar9) {
    uVar11 = readInt(this);
    local_a8.str._M_dataplus._M_p = (pointer)0x0;
    local_a8.str._M_string_length = 0;
    local_a8.str.field_2._M_allocated_capacity = 0;
    local_a8.str.field_2._M_local_buf[8] = '\x01';
    ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::resize
              ((vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> *)
               &local_a8,(ulong)uVar11);
    if (uVar11 != 0) {
      lVar19 = 0;
      do {
        readVector3(this,(vector3df *)(local_a8.str._M_dataplus._M_p + lVar19));
        lVar19 = lVar19 + 0xc;
      } while ((ulong)uVar11 * 0xc != lVar19);
    }
    bVar9 = checkForTwoFollowingSemicolons(this);
    if (!bVar9) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      core::string<char>::string(&local_58,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
        operator_delete(local_58.str._M_dataplus._M_p,local_58.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    local_58.str._M_dataplus._M_p = (pointer)0x0;
    local_58.str._M_string_length = 0;
    uVar20 = 0;
    local_58.str.field_2._M_allocated_capacity = 0;
    local_58.str.field_2._M_local_buf[8] = '\x01';
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
               (ulong)((long)(mesh->Indices).m_data.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(mesh->Indices).m_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
    uVar11 = readInt(this);
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70 = 1;
    if (uVar11 != 0) {
      uVar16 = 0;
      do {
        uVar12 = readInt(this);
        _Var8._M_p = local_a8.str._M_dataplus._M_p;
        uVar15 = uVar12 - 2;
        uVar13 = (uint)(mesh->IndexCountPerFace).m_data.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
        if (uVar15 * 3 == uVar13) {
          if (uVar15 == 1) {
            iVar18 = 0;
            do {
              uVar12 = readInt(this);
              pSVar5 = (mesh->Vertices).m_data.
                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar2 = (mesh->Indices).m_data.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[(uint)((int)uVar20 + iVar18)];
              uVar1 = *(undefined8 *)(_Var8._M_p + (ulong)uVar12 * 0xc);
              pSVar7 = pSVar5 + uVar2;
              (pSVar7->Normal).X = (float)(int)uVar1;
              (pSVar7->Normal).Y = (float)(int)((ulong)uVar1 >> 0x20);
              pSVar5[uVar2].Normal.Z = *(float *)(_Var8._M_p + (ulong)uVar12 * 0xc + 8);
              iVar18 = iVar18 + 1;
            } while (iVar18 != 3);
            uVar20 = (ulong)((int)uVar20 + 3);
          }
          else {
            local_60 = (ulong)uVar15;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&local_88,(ulong)uVar12);
            puVar6 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (uVar12 != 0) {
              uVar17 = 0;
              do {
                uVar14 = readInt(this);
                puVar6[uVar17] = uVar14;
                uVar17 = uVar17 + 1;
              } while (uVar12 != uVar17);
            }
            if ((int)local_60 != 0) {
              pSVar5 = (mesh->Vertices).m_data.
                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar6 = (mesh->Indices).m_data.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar2 = *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar17 = 2;
              do {
                iVar18 = (int)uVar20;
                uVar3 = puVar6[uVar20];
                uVar1 = *(undefined8 *)(local_a8.str._M_dataplus._M_p + (ulong)uVar2 * 0xc);
                pSVar5[uVar3].Normal.X = (float)(int)uVar1;
                pSVar5[uVar3].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
                pSVar5[uVar3].Normal.Z =
                     *(float *)(local_a8.str._M_dataplus._M_p + (ulong)uVar2 * 0xc + 8);
                uVar3 = puVar6[iVar18 + 1];
                uVar4 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17 - 1];
                uVar1 = *(undefined8 *)(local_a8.str._M_dataplus._M_p + (ulong)uVar4 * 0xc);
                pSVar5[uVar3].Normal.X = (float)(int)uVar1;
                pSVar5[uVar3].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
                pSVar5[uVar3].Normal.Z =
                     *(float *)(local_a8.str._M_dataplus._M_p + (ulong)uVar4 * 0xc + 8);
                uVar20 = (ulong)(iVar18 + 3);
                uVar3 = puVar6[iVar18 + 2];
                uVar4 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17 & 0xffffffff];
                uVar1 = *(undefined8 *)(local_a8.str._M_dataplus._M_p + (ulong)uVar4 * 0xc);
                pSVar5[uVar3].Normal.X = (float)(int)uVar1;
                pSVar5[uVar3].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
                pSVar5[uVar3].Normal.Z =
                     *(float *)(local_a8.str._M_dataplus._M_p + (ulong)uVar4 * 0xc + 8);
                lVar19 = uVar17 - (local_60 & 0xffffffff);
                uVar17 = uVar17 + 1;
              } while (lVar19 != 1);
            }
          }
        }
        else {
          os::Printer::log((Printer *)"Not matching normal and face index count found in x file",
                           (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          core::string<char>::string(&local_c8,this->Line);
          os::Printer::log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.str._M_dataplus._M_p != &local_c8.str.field_2) {
            operator_delete(local_c8.str._M_dataplus._M_p,
                            local_c8.str.field_2._M_allocated_capacity + 1);
          }
          this->ErrorState = true;
        }
        if (uVar15 * 3 != uVar13) goto LAB_001bc380;
        uVar15 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar15;
      } while (uVar15 != uVar11);
    }
    bVar9 = checkForTwoFollowingSemicolons(this);
    if (!bVar9) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Face Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      core::string<char>::string(&local_c8,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.str._M_dataplus._M_p != &local_c8.str.field_2) {
        operator_delete(local_c8.str._M_dataplus._M_p,local_c8.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    bVar10 = checkForClosingBrace(this);
    bVar9 = true;
    if (!bVar10) {
      os::Printer::log((Printer *)"No closing brace in Mesh Normals found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      core::string<char>::string(&local_c8,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.str._M_dataplus._M_p != &local_c8.str.field_2) {
        operator_delete(local_c8.str._M_dataplus._M_p,local_c8.str.field_2._M_allocated_capacity + 1
                       );
      }
      this->ErrorState = true;
LAB_001bc380:
      bVar9 = false;
    }
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_58.str._M_dataplus._M_p,
                      local_58.str.field_2._M_allocated_capacity -
                      (long)local_58.str._M_dataplus._M_p);
    }
    if (local_a8.str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a8.str._M_dataplus._M_p,
                      local_a8.str.field_2._M_allocated_capacity -
                      (long)local_a8.str._M_dataplus._M_p);
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh Normals found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string(&local_a8,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.str._M_dataplus._M_p != &local_a8.str.field_2) {
      operator_delete(local_a8.str._M_dataplus._M_p,local_a8.str.field_2._M_allocated_capacity + 1);
    }
    this->ErrorState = true;
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshNormals(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh normals", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read count
	const u32 nNormals = readInt();
	core::array<core::vector3df> normals;
	normals.set_used(nNormals);

	// read normals
	for (u32 i = 0; i < nNormals; ++i)
		readVector3(normals[i]);

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	core::array<u32> normalIndices;
	normalIndices.set_used(mesh.Indices.size());

	// read face normal indices
	const u32 nFNormals = readInt();
	// if (nFNormals >= mesh.IndexCountPerFace.size())
	if (0) { // this condition doesn't work for some reason
		os::Printer::log("Too many face normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	u32 normalidx = 0;
	core::array<u32> polygonfaces;
	for (u32 k = 0; k < nFNormals; ++k) {
		const u32 fcnt = readInt();
		u32 triangles = fcnt - 2;
		u32 indexcount = triangles * 3;

		if (indexcount != mesh.IndexCountPerFace[k]) {
			os::Printer::log("Not matching normal and face index count found in x file", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}

		if (indexcount == 3) {
			// default, only one triangle in this face
			for (u32 h = 0; h < 3; ++h) {
				const u32 normalnum = readInt();
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[normalnum]);
			}
		} else {
			polygonfaces.set_used(fcnt);
			// multiple triangles in this face
			for (u32 h = 0; h < fcnt; ++h)
				polygonfaces[h] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[0]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 1]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 2]]);
			}
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}